

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O2

int coda_ascbin_cursor_get_bit_size(coda_cursor *cursor,int64_t *bit_size)

{
  int64_t *piVar1;
  coda_expression *expr;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  coda_dynamic_type *pcVar5;
  long lVar6;
  long lVar7;
  coda_type *pcVar8;
  int64_t iVar9;
  int64_t field_bit_size;
  int available;
  int64_t rel_bit_offset;
  anon_struct_24_3_5e6533e2 *local_348;
  coda_cursor field_cursor;
  
  pcVar8 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar8->format) {
    pcVar8 = *(coda_type **)&pcVar8->type_class;
  }
  lVar7 = pcVar8->bit_size;
  if (lVar7 < 0) {
    if (pcVar8->type_class == 1) {
      iVar2 = coda_cursor_get_num_elements(cursor,&rel_bit_offset);
      iVar9 = rel_bit_offset;
      if (iVar2 == 0) {
        if (rel_bit_offset == 0) {
          *bit_size = 0;
        }
        else {
          if (-1 < (*(coda_type **)(pcVar8 + 1))->bit_size) {
            lVar7 = (*(coda_type **)(pcVar8 + 1))->bit_size * rel_bit_offset;
            goto LAB_001198e1;
          }
          memcpy(&field_cursor,cursor,0x310);
          lVar7 = (long)field_cursor.n;
          uVar4 = (ulong)(field_cursor.n + 1U);
          field_cursor.n = field_cursor.n + 1U;
          field_cursor.stack[lVar7].bit_offset = field_cursor.stack[lVar7 + -1].bit_offset;
          lVar7 = 0;
          for (lVar6 = 0; lVar6 < iVar9; lVar6 = lVar6 + 1) {
            iVar2 = (int)uVar4 + -1;
            field_cursor.stack[iVar2].type = (coda_dynamic_type_struct *)*(coda_type **)(pcVar8 + 1)
            ;
            field_cursor.stack[iVar2].index = lVar6;
            iVar2 = coda_cursor_get_bit_size(&field_cursor,&field_bit_size);
            if (iVar2 != 0) goto LAB_001199f2;
            uVar4 = (ulong)field_cursor.n;
            piVar1 = &field_cursor.stack[uVar4 - 1].bit_offset;
            *piVar1 = *piVar1 + field_bit_size;
            lVar7 = lVar7 + field_bit_size;
            iVar9 = rel_bit_offset;
          }
          *bit_size = lVar7;
        }
        goto LAB_001198e4;
      }
    }
    else {
      if (pcVar8->type_class != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-ascbin-cursor.c"
                      ,0x300,"int coda_ascbin_cursor_get_bit_size(const coda_cursor *, int64_t *)");
      }
      piVar3 = (int *)__tls_get_addr(&PTR_001d8d40);
      if ((*piVar3 == 0) || (pcVar8->size_expr == (coda_expression *)0x0)) {
        if (pcVar8[1].attributes == (coda_type_record *)0x0) {
          if ((long)pcVar8[1].name < 1) {
            iVar9 = 0;
          }
          else {
            memcpy(&field_cursor,cursor,0x310);
            iVar2 = coda_cursor_goto_first_record_field(&field_cursor);
            if (iVar2 != 0) goto LAB_001199f2;
            local_348 = cursor->stack;
            iVar9 = 0;
            lVar7 = 0;
            while (lVar7 < (long)pcVar8[1].name) {
              field_bit_size = -1;
              if (lVar7 < (long)(pcVar8[1].name + -1)) {
                iVar2 = get_next_relative_field_bit_offset
                                  (&field_cursor,&rel_bit_offset,&field_bit_size);
                if (iVar2 != 0) goto LAB_001199f2;
                if (field_bit_size < 0) goto LAB_00119b2e;
              }
              else {
LAB_00119b2e:
                iVar2 = coda_cursor_get_bit_size(&field_cursor,&field_bit_size);
                if (iVar2 != 0) goto LAB_001199f2;
              }
              iVar9 = iVar9 + field_bit_size;
              if (lVar7 < (long)(pcVar8[1].name + -1)) {
                available = 1;
                expr = *(coda_expression **)
                        (*(long *)(pcVar8[1].description + lVar7 * 8 + 8) + 0x20);
                if (expr == (coda_expression *)0x0) {
LAB_00119b8f:
                  pcVar5 = *(coda_dynamic_type **)
                            (*(long *)(pcVar8[1].description + lVar7 * 8 + 8) + 0x10);
                }
                else {
                  iVar2 = coda_expression_eval_bool(expr,cursor,&available);
                  if (iVar2 != 0) goto LAB_001199f2;
                  if (available != 0) goto LAB_00119b8f;
                  pcVar5 = coda_no_data_singleton(pcVar8->format);
                }
                lVar7 = lVar7 + 1;
                lVar6 = (long)field_cursor.n;
                field_cursor.stack[lVar6 + -1].type = pcVar5;
                field_cursor.stack[lVar6 + -1].index = lVar7;
                field_cursor.stack[lVar6 + -1].bit_offset =
                     rel_bit_offset + local_348[(long)cursor->n + -1].bit_offset;
              }
              else {
                lVar7 = lVar7 + 1;
              }
            }
          }
          *bit_size = iVar9;
          goto LAB_001198e4;
        }
        memcpy(&field_cursor,cursor,0x310);
        iVar2 = coda_cursor_goto_available_union_field(&field_cursor);
        if ((iVar2 == 0) && (iVar2 = coda_cursor_get_bit_size(&field_cursor,bit_size), iVar2 == 0))
        goto LAB_001198e4;
      }
      else {
        iVar2 = coda_expression_eval_integer(pcVar8->size_expr,cursor,bit_size);
        if (iVar2 == 0) {
          lVar7 = *bit_size;
          if (pcVar8->bit_size == -8) {
            lVar7 = lVar7 << 3;
            *bit_size = lVar7;
          }
          if (-1 < lVar7) goto LAB_001198e4;
          coda_set_error(-300,"calculated size is negative (%ld bits)");
        }
        else {
          coda_add_error_message(" for size expression");
        }
        coda_cursor_add_to_error_message(cursor);
      }
    }
LAB_001199f2:
    iVar2 = -1;
  }
  else {
LAB_001198e1:
    *bit_size = lVar7;
LAB_001198e4:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int coda_ascbin_cursor_get_bit_size(const coda_cursor *cursor, int64_t *bit_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (type->bit_size >= 0)
    {
        *bit_size = type->bit_size;
    }
    else
    {
        switch (type->type_class)
        {
            case coda_record_class:
                {
                    coda_type_record *record = (coda_type_record *)type;

                    if (coda_option_use_fast_size_expressions && record->size_expr != NULL)
                    {
                        if (coda_expression_eval_integer(record->size_expr, cursor, bit_size) != 0)
                        {
                            coda_add_error_message(" for size expression");
                            coda_cursor_add_to_error_message(cursor);
                            return -1;
                        }
                        if (record->bit_size == -8)
                        {
                            /* convert 'byte size' to 'bit size' */
                            *bit_size *= 8;
                        }
                        if (*bit_size < 0)
                        {
                            coda_set_error(CODA_ERROR_PRODUCT, "calculated size is negative (%ld bits)",
                                           (long)*bit_size);
                            coda_cursor_add_to_error_message(cursor);
                            return -1;
                        }
                    }
                    else if (record->union_field_expr != NULL)
                    {
                        coda_cursor field_cursor;

                        field_cursor = *cursor;
                        if (coda_cursor_goto_available_union_field(&field_cursor) != 0)
                        {
                            return -1;
                        }
                        if (coda_cursor_get_bit_size(&field_cursor, bit_size) != 0)
                        {
                            return -1;
                        }
                    }
                    else
                    {
                        int64_t record_bit_size;

                        record_bit_size = 0;
                        if (record->num_fields > 0)
                        {
                            coda_cursor field_cursor;
                            long i;

                            field_cursor = *cursor;
                            if (coda_cursor_goto_first_record_field(&field_cursor) != 0)
                            {
                                return -1;
                            }
                            for (i = 0; i < record->num_fields; i++)
                            {
                                int64_t rel_bit_offset;
                                int64_t field_bit_size;

                                field_bit_size = -1;
                                if (i < record->num_fields - 1)
                                {
                                    if (get_next_relative_field_bit_offset(&field_cursor, &rel_bit_offset,
                                                                           &field_bit_size) != 0)
                                    {
                                        return -1;
                                    }
                                }
                                if (field_bit_size < 0)
                                {
                                    if (coda_cursor_get_bit_size(&field_cursor, &field_bit_size) != 0)
                                    {
                                        return -1;
                                    }
                                }
                                record_bit_size += field_bit_size;
                                if (i < record->num_fields - 1)
                                {
                                    int available = 1;

                                    if (record->field[i + 1]->available_expr != NULL)
                                    {
                                        if (coda_expression_eval_bool(record->field[i + 1]->available_expr, cursor,
                                                                      &available) != 0)
                                        {
                                            return -1;
                                        }
                                    }
                                    if (available)
                                    {
                                        field_cursor.stack[field_cursor.n - 1].type =
                                            (coda_dynamic_type *)record->field[i + 1]->type;
                                    }
                                    else
                                    {
                                        field_cursor.stack[field_cursor.n - 1].type =
                                            coda_no_data_singleton(record->format);
                                    }
                                    field_cursor.stack[field_cursor.n - 1].index = i + 1;
                                    field_cursor.stack[field_cursor.n - 1].bit_offset =
                                        cursor->stack[cursor->n - 1].bit_offset + rel_bit_offset;
                                }
                            }
                        }
                        *bit_size = record_bit_size;
                    }
                }
                break;
            case coda_array_class:
                {
                    coda_type_array *array = (coda_type_array *)type;
                    long num_elements;

                    /* get the number of elements in array */
                    if (coda_cursor_get_num_elements(cursor, &num_elements) != 0)
                    {
                        return -1;
                    }

                    if (num_elements == 0)
                    {
                        /* empty array */
                        *bit_size = 0;
                    }
                    else if (array->base_type->bit_size >= 0)
                    {
                        /* the basetype has a constant size. */
                        *bit_size = num_elements * array->base_type->bit_size;
                    }
                    else
                    {
                        coda_cursor array_cursor;
                        int64_t array_bit_size;
                        long i;

                        /* sum the sizes of the elements 'manually' */
                        array_bit_size = 0;
                        array_cursor = *cursor;
                        array_cursor.n++;
                        array_cursor.stack[array_cursor.n - 1].bit_offset =
                            array_cursor.stack[array_cursor.n - 2].bit_offset;
                        for (i = 0; i < num_elements; i++)
                        {
                            int64_t element_bit_size;

                            array_cursor.stack[array_cursor.n - 1].type = (coda_dynamic_type *)array->base_type;
                            array_cursor.stack[array_cursor.n - 1].index = i;
                            if (coda_cursor_get_bit_size(&array_cursor, &element_bit_size) != 0)
                            {
                                return -1;
                            }
                            array_bit_size += element_bit_size;
                            array_cursor.stack[array_cursor.n - 1].bit_offset += element_bit_size;
                        }
                        *bit_size = array_bit_size;
                    }
                }
                break;
            default:
                assert(0);
                exit(1);
        }
    }

    return 0;
}